

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O3

void __thiscall restincurl::Worker::~Worker(Worker *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  peVar1 = (this->thread_).
           super___shared_ptr<restincurl::Worker::WorkerThread,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar1 != (element_type *)0x0) && ((peVar1->thread_)._M_id._M_thread != 0)) {
    Close(this);
    Join(this);
  }
  Signaler::~Signaler(&this->signal_);
  std::
  _Rb_tree<void_*,_std::pair<void_*const,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>,_std::_Select1st<std::pair<void_*const,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>_>
  ::~_Rb_tree(&(this->ongoing_)._M_t);
  std::
  deque<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
  ::~deque(&this->queue_);
  this_00 = (this->thread_).
            super___shared_ptr<restincurl::Worker::WorkerThread,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

~Worker() {
            if (thread_ && thread_->Joinable()) {
                Close();
                Join();
            }
        }